

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

ctmbstr prvTidygetNextOptionPick(TidyOptionImpl *option,TidyIterator *iter)

{
  TidyIterator p_Var1;
  TidyIterator local_38;
  PickListItem *item;
  ctmbstr val;
  size_t ix;
  TidyIterator *iter_local;
  TidyOptionImpl *option_local;
  
  item = (PickListItem *)0x0;
  if ((option != (TidyOptionImpl *)0x0) && (iter != (TidyIterator *)0x0)) {
    p_Var1 = *iter;
    if (option->pickList != (PickListItems *)0x0) {
      if (((p_Var1 != (TidyIterator)0x0) && (p_Var1 < (TidyIterator)0x10)) &&
         (option->pickList != (PickListItems *)0x0)) {
        item = (PickListItem *)(*option->pickList)[(long)((long)&p_Var1[-1]._opaque + 3)].label;
      }
      if ((item == (PickListItem *)0x0) || ((*option->pickList)[(long)p_Var1].label == (ctmbstr)0x0)
         ) {
        local_38 = (TidyIterator)0x0;
      }
      else {
        local_38 = (TidyIterator)((long)&p_Var1->_opaque + 1);
      }
      *iter = local_38;
    }
    return (ctmbstr)item;
  }
  __assert_fail("option!=NULL && iter != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/config.c"
                ,0x714,"ctmbstr prvTidygetNextOptionPick(const TidyOptionImpl *, TidyIterator *)");
}

Assistant:

ctmbstr      TY_(getNextOptionPick)( const TidyOptionImpl* option,
                                     TidyIterator* iter )
{
    size_t ix;
    ctmbstr val = NULL;
    const PickListItem *item= NULL;
    assert( option!=NULL && iter != NULL );

    ix = (size_t) *iter;
    
    if ( option->pickList )
    {
        if ( ix > 0 && ix < TIDY_PL_SIZE && option->pickList )
        {
            item = &(*option->pickList)[ ix-1 ];
            val = item->label;
        }
        item = &(*option->pickList)[ ix ];
        *iter = (TidyIterator) ( val && item->label ? ix + 1 : (size_t)0 );
    }
    
    return val;
}